

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,PolarSpeakerPosition *pos,
          bool isLfe,double tol)

{
  pointer *pppVar1;
  double start;
  double end;
  double dVar2;
  type tVar3;
  pointer pCVar4;
  _Alloc_hider _Var5;
  long lVar6;
  iterator __position;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  PolarSpeakerPosition *pPVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  Channel channel;
  RowVector3d cartPosition;
  double local_218;
  pair<int,_double> local_1c8;
  Vector3d local_1b8;
  double local_198;
  double dStack_190;
  double local_188;
  char local_180;
  type local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  char local_160;
  type local_158;
  undefined8 uStack_150;
  char local_148;
  type local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  double *local_128;
  double dStack_120;
  double *local_118;
  double adStack_110 [3];
  undefined1 local_f8 [128];
  dummy_u local_78;
  bool local_58;
  dummy_u local_50;
  
  pPVar11 = pos;
  pdVar9 = (double *)local_f8;
  for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pdVar9 = pPVar11->azimuth;
    pPVar11 = (PolarSpeakerPosition *)&pPVar11->azimuthMin;
    pdVar9 = pdVar9 + 1;
  }
  local_f8[0x78] = false;
  bVar13 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar13) {
    local_78.aligner_ = (type)((long)local_f8 + 0x90);
    tVar3 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x80),tVar3,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar3);
  }
  local_58 = false;
  bVar14 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_f8[0x78] = bVar13;
  if (bVar14) {
    local_50.aligner_ = (type)((long)local_f8 + 0xb8);
    tVar3 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0xa8),tVar3,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar3);
  }
  local_58 = bVar14;
  toCartesianVector3d(&local_1b8,(PolarSpeakerPosition *)local_f8);
  local_128 = (double *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  dStack_120 = local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
  local_118 = (double *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  adStack_110[0] =
       local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  adStack_110[1] =
       local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  if (local_58 == true) {
    if (local_50.aligner_ != (type)((long)local_f8 + 0xb8)) {
      operator_delete((void *)local_50.aligner_,local_50._16_8_ + 1);
    }
    local_58 = false;
  }
  if (local_f8[0x78] == true) {
    if (local_78.aligner_ != (type)((long)local_f8 + 0x90)) {
      operator_delete((void *)local_78.aligner_,local_78._16_8_ + 1);
    }
    local_f8[0x78] = false;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < this->_nChannels) {
    local_218 = pos->distance;
    uVar15 = SUB84(local_218,0);
    uVar16 = (undefined4)((ulong)local_218 >> 0x20);
    if ((pos->distanceMax).super_type.m_initialized != false) {
      local_218 = (pos->distanceMax).super_type.m_storage;
    }
    if ((pos->distanceMin).super_type.m_initialized != false) {
      dVar17 = (pos->distanceMin).super_type.m_storage;
      uVar15 = SUB84(dVar17,0);
      uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
    }
    dVar17 = pos->elevation;
    dVar18 = dVar17;
    if ((pos->elevationMax).super_type.m_initialized != false) {
      dVar18 = (pos->elevationMax).super_type.m_storage;
    }
    if ((pos->elevationMin).super_type.m_initialized != false) {
      dVar17 = (pos->elevationMin).super_type.m_storage;
    }
    start = (&pos->azimuth)[(ulong)(pos->azimuthMin).super_type.m_initialized * 2];
    end = (&pos->azimuth)[(ulong)(pos->azimuthMax).super_type.m_initialized * 4];
    lVar12 = 0;
    lVar8 = 0;
    do {
      pvVar7 = Layout::channels(&this->_layout);
      local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)(local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2);
      pCVar4 = (pvVar7->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var5._M_p = pCVar4[lVar8]._name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,_Var5._M_p,_Var5._M_p + pCVar4[lVar8]._name._M_string_length);
      local_188 = pCVar4[lVar8]._polarPosition.distance;
      local_198 = pCVar4[lVar8]._polarPosition.azimuth;
      dStack_190 = pCVar4[lVar8]._polarPosition.elevation;
      local_180 = pCVar4[lVar8]._polarPositionNominal.super_type.m_initialized == true;
      if ((bool)local_180) {
        local_168 = *(undefined8 *)
                     ((long)&pCVar4[lVar8]._polarPositionNominal.super_type.m_storage + 0x10);
        local_178 = pCVar4[lVar8]._polarPositionNominal.super_type.m_storage.dummy_.aligner_;
        uStack_170 = *(undefined8 *)
                      ((long)&pCVar4[lVar8]._polarPositionNominal.super_type.m_storage + 8);
      }
      local_160 = pCVar4[lVar8]._azimuthRange.super_type.m_initialized == true;
      if ((bool)local_160) {
        local_158 = pCVar4[lVar8]._azimuthRange.super_type.m_storage.dummy_.aligner_;
        uStack_150 = *(undefined8 *)((long)&pCVar4[lVar8]._azimuthRange.super_type.m_storage + 8);
      }
      local_148 = pCVar4[lVar8]._elevationRange.super_type.m_initialized == true;
      if ((bool)local_148) {
        local_140 = pCVar4[lVar8]._elevationRange.super_type.m_storage.dummy_.aligner_;
        uStack_138 = *(undefined8 *)((long)&pCVar4[lVar8]._elevationRange.super_type.m_storage + 8);
      }
      local_130 = pCVar4[lVar8]._isLfe;
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                     );
      }
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[lVar8] == isLfe) {
        if ((this->_azimuths).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar8) goto LAB_0015f560;
        bVar13 = insideAngleRange((this->_azimuths).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[lVar8],start,end,tol);
        lVar10 = (this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (!bVar13) {
          if (lVar10 <= lVar8) goto LAB_0015f560;
          if (ABS((this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  .m_storage.m_data[lVar8]) < 90.0 - tol) goto LAB_0015f4e2;
        }
        if (lVar10 <= lVar8) {
LAB_0015f560:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar2 = (this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar8];
        if ((dVar17 - tol < dVar2) && (dVar2 < dVar18 + tol)) {
          if ((this->_distances).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar8) goto LAB_0015f560;
          dVar2 = (this->_distances).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[lVar8];
          if (((double)CONCAT44(uVar16,uVar15) - tol < dVar2) && (dVar2 < local_218 + tol)) {
            pdVar9 = (this->_positions).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
            lVar10 = (this->_positions).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols;
            if (lVar10 < 0 && pdVar9 != (double *)0x0) {
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                            ,0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                           );
            }
            lVar6 = (this->_positions).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
            if (lVar6 <= lVar8) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                            ,0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                           );
            }
            if (lVar10 != 3) {
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x74,
                            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Matrix<double, 1, 3>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Rhs = const Eigen::Matrix<double, 1, 3>]"
                           );
            }
            local_1c8.second =
                 (pdVar9[lVar8] - (double)local_128) * (pdVar9[lVar8] - (double)local_128);
            pdVar9 = (double *)(lVar12 + lVar6 * 8 + (long)pdVar9);
            lVar10 = 0;
            do {
              local_1c8.second =
                   local_1c8.second +
                   (*pdVar9 - adStack_110[lVar10]) * (*pdVar9 - adStack_110[lVar10]);
              lVar10 = lVar10 + 1;
              pdVar9 = pdVar9 + lVar6;
            } while (lVar10 != 2);
            local_1c8.second = SQRT(local_1c8.second);
            local_1c8.first = (int)lVar8;
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              _M_realloc_insert<std::pair<int,double>>
                        ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                         __return_storage_ptr__,__position,&local_1c8);
            }
            else {
              *(ulong *)__position._M_current = CONCAT44(local_1c8._4_4_,local_1c8.first);
              (__position._M_current)->second = local_1c8.second;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
        }
      }
LAB_0015f4e2:
      if (local_148 == '\x01') {
        local_148 = '\0';
      }
      if (local_160 == '\x01') {
        local_160 = '\0';
      }
      if (local_180 == '\x01') {
        local_180 = '\0';
      }
      if ((double *)
          local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] !=
          local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array + 2) {
        operator_delete((void *)local_1b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0],
                        (long)local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[2] + 1);
      }
      lVar8 = lVar8 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar8 < this->_nChannels);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const PolarSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;
    double azMin = boost::get_optional_value_or(pos.azimuthMin, pos.azimuth);
    double azMax = boost::get_optional_value_or(pos.azimuthMax, pos.azimuth);
    double elMin =
        boost::get_optional_value_or(pos.elevationMin, pos.elevation);
    double elMax =
        boost::get_optional_value_or(pos.elevationMax, pos.elevation);
    double distMin =
        boost::get_optional_value_or(pos.distanceMin, pos.distance);
    double distMax =
        boost::get_optional_value_or(pos.distanceMax, pos.distance);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if ((insideAngleRange(_azimuths(i), azMin, azMax, tol) ||
             std::abs(_elevations(i)) >= 90.0 - tol) &&
            (_elevations(i) > elMin - tol) && (_elevations(i) < elMax + tol) &&
            (_distances(i) > distMin - tol) &&
            (_distances(i) < distMax + tol)) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }